

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io__writer.cc
# Opt level: O0

bool __thiscall xemmai::io::t_writer::f__resume(t_writer *this,t_io *a_library)

{
  t_queue<256UL> *this_00;
  bool bVar1;
  t_object *ptVar2;
  __pointer_type ptVar3;
  long *in_FS_OFFSET;
  t_io *a_library_local;
  t_writer *this_local;
  __pointer_type p;
  
  ptVar2 = t_slot::operator_cast_to_t_object_(&this->v_value);
  if (ptVar2 != (t_object *)0x0) {
    bVar1 = f_write(this,a_library,&this->v_p0,&this->v_n0);
    if (!bVar1) {
      return false;
    }
    ptVar3 = std::atomic<xemmai::t_object_*>::exchange
                       (&(this->v_value).v_p,(__pointer_type)0x0,relaxed);
    if ((__pointer_type)0x4 < ptVar3) {
      this_00 = *(t_queue<256UL> **)(*in_FS_OFFSET + -0x70);
      *this_00->v_head = ptVar3;
      if (this_00->v_head == this_00->v_next) {
        t_slot::t_queue<256UL>::f_next(this_00);
      }
      else {
        this_00->v_head = this_00->v_head + 1;
      }
    }
  }
  switch(this->v_step) {
  case 1:
    goto switchD_00281c1d_caseD_1;
  case 2:
    goto switchD_00281c1d_caseD_2;
  case 3:
    break;
  case 4:
    this->v_p0 = (char *)L"\n";
    this->v_n0 = 4;
    this->v_step = this->v_step + -1;
    break;
  default:
    goto switchD_00281c1d_default;
  }
  bVar1 = f_write(this,a_library,&this->v_p0,&this->v_n0);
  if (bVar1) {
    this->v_step = this->v_step + -1;
switchD_00281c1d_caseD_2:
    bVar1 = f_write(this,a_library,(char **)0x0,(size_t *)0x0);
    if (bVar1) {
      this->v_step = this->v_step + -1;
switchD_00281c1d_caseD_1:
      bVar1 = f_write(this,a_library);
      if (bVar1) {
        this->v_step = this->v_step + -1;
switchD_00281c1d_default:
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool t_writer::f__resume(t_io* a_library)
{
	if (v_value) {
		if (!f_write(a_library, &v_p0, &v_n0)) return false;
		v_value = nullptr;
	}
	switch (v_step) {
	case 4:
		v_p0 = const_cast<char*>(reinterpret_cast<const char*>(L"\n"));
		v_n0 = sizeof(wchar_t);
		--v_step;
	case 3:
		if (!f_write(a_library, &v_p0, &v_n0)) return false;
		--v_step;
	case 2:
		if (!f_write(a_library, NULL, NULL)) return false;
		--v_step;
	case 1:
		if (!f_write(a_library)) return false;
		--v_step;
	}
	return true;
}